

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::ShuffleNode(WasmBinaryReader *this)

{
  uchar uVar1;
  uint local_14;
  uint32 i;
  WasmBinaryReader *this_local;
  
  CheckBytesLeft(this,0x10);
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    uVar1 = ReadConst<unsigned_char>(this);
    *(uchar *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + (ulong)local_14) = uVar1;
  }
  (this->m_funcState).count = (this->m_funcState).count + 0x10;
  return;
}

Assistant:

void WasmBinaryReader::ShuffleNode()
{
    CheckBytesLeft(Simd::MAX_LANES);
    for (uint32 i = 0; i < Simd::MAX_LANES; i++)
    {
        m_currentNode.shuffle.indices[i] = ReadConst<uint8>();
    }
    m_funcState.count += Simd::MAX_LANES;
}